

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsizegrip.cpp
# Opt level: O0

void __thiscall QSizeGrip::mouseMoveEvent(QSizeGrip *this,QMouseEvent *e)

{
  bool bVar1;
  QFlagsStorage<Qt::MouseButton> QVar2;
  int iVar3;
  QSizeGripPrivate *this_00;
  QWidget *r;
  int *piVar4;
  MouseButton *pMVar5;
  long in_FS_OFFSET;
  QWidget *tlw;
  QSizeGripPrivate *d;
  QRect nr;
  QPoint p;
  QSize ns;
  QPoint np;
  int in_stack_ffffffffffffff28;
  int in_stack_ffffffffffffff2c;
  MouseButton in_stack_ffffffffffffff30;
  WidgetAttribute in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff38;
  QFlagsStorage<Qt::MouseButton> in_stack_ffffffffffffff3c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff4c;
  int in_stack_ffffffffffffff50;
  int in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff68;
  QSize *in_stack_ffffffffffffffa0;
  QWidget *in_stack_ffffffffffffffa8;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  QSize local_28;
  QPointF local_20;
  QPoint local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QSizeGrip *)0x680d45);
  QVar2.i = (Int)QSinglePointEvent::buttons
                           ((QSinglePointEvent *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
  bVar1 = ::operator!=((QFlags<Qt::MouseButton>)in_stack_ffffffffffffff3c.i,
                       in_stack_ffffffffffffff30);
  if ((bVar1) || ((this_00->m_platformSizeGrip & 1U) != 0)) {
    QWidget::mouseMoveEvent
              ((QWidget *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
               (QMouseEvent *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  }
  else {
    r = qt_sizegrip_topLevelWidget
                  ((QWidget *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
    if (((this_00->gotMousePress & 1U) != 0) &&
       (bVar1 = QWidget::testAttribute
                          ((QWidget *)
                           CONCAT44(in_stack_ffffffffffffff3c.i,in_stack_ffffffffffffff38),
                           in_stack_ffffffffffffff34), !bVar1)) {
      local_10 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
      local_20 = QSinglePointEvent::globalPosition((QSinglePointEvent *)0x680ddc);
      local_10 = QPointF::toPoint((QPointF *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      local_28 = (QSize)&DAT_aaaaaaaaaaaaaaaa;
      QSize::QSize((QSize *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      bVar1 = QSizeGripPrivate::atBottom(this_00);
      if (bVar1) {
        in_stack_ffffffffffffff50 =
             QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        in_stack_ffffffffffffff4c = QPoint::y((QPoint *)0x680e54);
        local_2c = QPoint::y((QPoint *)0x680e69);
        local_2c = in_stack_ffffffffffffff4c - local_2c;
        piVar4 = qMin<int>(&local_2c,&this_00->dyMax);
        in_stack_ffffffffffffff54 = in_stack_ffffffffffffff50 + *piVar4;
        piVar4 = QSize::rheight((QSize *)0x680eab);
        *piVar4 = in_stack_ffffffffffffff54;
      }
      else {
        in_stack_ffffffffffffff44 =
             QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        in_stack_ffffffffffffff40 = QPoint::y((QPoint *)0x680ed5);
        local_30 = QPoint::y((QPoint *)0x680eea);
        local_30 = in_stack_ffffffffffffff40 - local_30;
        piVar4 = qMax<int>(&local_30,&this_00->dyMax);
        in_stack_ffffffffffffff48 = in_stack_ffffffffffffff44 - *piVar4;
        piVar4 = QSize::rheight((QSize *)0x680f2c);
        *piVar4 = in_stack_ffffffffffffff48;
      }
      bVar1 = QSizeGripPrivate::atLeft(this_00);
      if (bVar1) {
        iVar3 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
        ;
        in_stack_ffffffffffffff34 = QPoint::x((QPoint *)0x680f67);
        local_34 = QPoint::x((QPoint *)0x680f7c);
        local_34 = in_stack_ffffffffffffff34 - local_34;
        piVar4 = qMax<int>(&local_34,&this_00->dxMax);
        iVar3 = iVar3 - *piVar4;
        piVar4 = QSize::rwidth((QSize *)0x680fbe);
        *piVar4 = iVar3;
      }
      else {
        in_stack_ffffffffffffff2c =
             QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        in_stack_ffffffffffffff28 = QPoint::x((QPoint *)0x680fe8);
        local_38 = QPoint::x((QPoint *)0x680ffc);
        local_38 = in_stack_ffffffffffffff28 - local_38;
        piVar4 = qMin<int>(&local_38,&this_00->dxMax);
        in_stack_ffffffffffffff30 = in_stack_ffffffffffffff2c + *piVar4;
        pMVar5 = (MouseButton *)QSize::rwidth((QSize *)0x68103d);
        *pMVar5 = in_stack_ffffffffffffff30;
      }
      local_28 = QLayout::closestAcceptableSize(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0)
      ;
      QPoint::QPoint((QPoint *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30));
      QRect::QRect((QRect *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                   (QPoint *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                   (QSize *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      bVar1 = QSizeGripPrivate::atBottom(this_00);
      if (bVar1) {
        bVar1 = QSizeGripPrivate::atLeft(this_00);
        if (bVar1) {
          QRect::topRight((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          QRect::moveTopRight((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30)
                              ,(QPoint *)
                               CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        }
        else {
          QRect::topLeft((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          QRect::moveTopLeft((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                             (QPoint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28)
                            );
        }
      }
      else {
        bVar1 = QSizeGripPrivate::atLeft(this_00);
        if (bVar1) {
          QRect::bottomRight((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28))
          ;
          QRect::moveBottomRight
                    ((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (QPoint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        }
        else {
          QRect::bottomLeft((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
          QRect::moveBottomLeft
                    ((QRect *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (QPoint *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
        }
      }
      QWidget::setGeometry((QWidget *)CONCAT44(QVar2.i,in_stack_ffffffffffffff68),(QRect *)r);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QSizeGrip::mouseMoveEvent(QMouseEvent * e)
{
    Q_D(QSizeGrip);
    if (e->buttons() != Qt::LeftButton || d->m_platformSizeGrip) {
        QWidget::mouseMoveEvent(e);
        return;
    }

    QWidget* tlw = qt_sizegrip_topLevelWidget(this);
    if (!d->gotMousePress || tlw->testAttribute(Qt::WA_WState_ConfigPending))
        return;

    QPoint np(e->globalPosition().toPoint());

    // Don't extend beyond the available geometry; bound to dyMax and dxMax.
    QSize ns;
    if (d->atBottom())
        ns.rheight() = d->r.height() + qMin(np.y() - d->p.y(), d->dyMax);
    else
        ns.rheight() = d->r.height() - qMax(np.y() - d->p.y(), d->dyMax);

    if (d->atLeft())
        ns.rwidth() = d->r.width() - qMax(np.x() - d->p.x(), d->dxMax);
    else
        ns.rwidth() = d->r.width() + qMin(np.x() - d->p.x(), d->dxMax);

    ns = QLayout::closestAcceptableSize(tlw, ns);

    QPoint p;
    QRect nr(p, ns);
    if (d->atBottom()) {
        if (d->atLeft())
            nr.moveTopRight(d->r.topRight());
        else
            nr.moveTopLeft(d->r.topLeft());
    } else {
        if (d->atLeft())
            nr.moveBottomRight(d->r.bottomRight());
        else
            nr.moveBottomLeft(d->r.bottomLeft());
    }

    tlw->setGeometry(nr);
}